

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

upb_value * inttable_val(upb_inttable *t,uintptr_t key)

{
  upb_tabent *puVar1;
  upb_value *puVar2;
  uint uVar3;
  
  if (key < t->array_size) {
    if (t->array_size <= key) {
      __assert_fail("key < t->array_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x27d,"const upb_value *inttable_array_get(const upb_inttable *, uintptr_t)");
    }
    puVar2 = (upb_value *)0x0;
    if ((t->presence_mask[key >> 3] >> ((uint)key & 7) & 1) != 0) {
      puVar2 = t->array + key;
    }
    return puVar2;
  }
  if ((t->t).count != 0) {
    uVar3 = ((uint)(key >> 0x20) ^ (uint)key) & (t->t).mask;
    puVar1 = (t->t).entries;
    if (puVar1[uVar3].key.num != 0) {
      puVar1 = puVar1 + uVar3;
      do {
        if ((puVar1->key).num == key) {
          return &puVar1->val;
        }
        puVar1 = puVar1->next;
      } while (puVar1 != (_upb_tabent *)0x0);
    }
  }
  return (upb_value *)0x0;
}

Assistant:

static upb_value* inttable_val(upb_inttable* t, uintptr_t key) {
  if (key < t->array_size) {
    return (upb_value*)inttable_array_get(t, key);
  } else {
    upb_tabent* e =
        findentry_mutable(&t->t, intkey(key), upb_inthash(key), &inteql);
    return e ? &e->val : NULL;
  }
}